

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Geometry *pGVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  ulong uVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  Scene *pSVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong *puVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined4 uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar73;
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  float fVar86;
  float fVar94;
  float fVar95;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  float fVar96;
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  float fVar97;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar100 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar114 [64];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  float fVar121;
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_d24;
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  float local_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  long local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  uint local_c08;
  uint local_c04;
  uint local_c00;
  RTCFilterFunctionNArguments local_bf0;
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined4 local_a80;
  undefined4 uStack_a7c;
  undefined4 uStack_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 uStack_a68;
  undefined4 uStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  undefined1 auVar91 [32];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar97 = ray->tfar;
    if (0.0 <= fVar97) {
      puVar40 = local_7f8;
      aVar4 = (ray->dir).field_0;
      auVar46 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx((undefined1  [16])aVar4,auVar47);
      auVar87._8_4_ = 0x219392ef;
      auVar87._0_8_ = 0x219392ef219392ef;
      auVar87._12_4_ = 0x219392ef;
      auVar47 = vcmpps_avx(auVar47,auVar87,1);
      auVar88._8_4_ = 0x3f800000;
      auVar88._0_8_ = 0x3f8000003f800000;
      auVar88._12_4_ = 0x3f800000;
      auVar87 = vdivps_avx(auVar88,(undefined1  [16])aVar4);
      auVar89._8_4_ = 0x5d5e0b6b;
      auVar89._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar89._12_4_ = 0x5d5e0b6b;
      auVar47 = vblendvps_avx(auVar87,auVar89,auVar47);
      auVar79._0_4_ = auVar47._0_4_ * 0.99999964;
      auVar79._4_4_ = auVar47._4_4_ * 0.99999964;
      auVar79._8_4_ = auVar47._8_4_ * 0.99999964;
      auVar79._12_4_ = auVar47._12_4_ * 0.99999964;
      auVar68._0_4_ = auVar47._0_4_ * 1.0000004;
      auVar68._4_4_ = auVar47._4_4_ * 1.0000004;
      auVar68._8_4_ = auVar47._8_4_ * 1.0000004;
      auVar68._12_4_ = auVar47._12_4_ * 1.0000004;
      uVar52 = *(undefined4 *)&(ray->org).field_0;
      auVar107 = ZEXT1664(CONCAT412(uVar52,CONCAT48(uVar52,CONCAT44(uVar52,uVar52))));
      uVar52 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar111 = ZEXT1664(CONCAT412(uVar52,CONCAT48(uVar52,CONCAT44(uVar52,uVar52))));
      uVar52 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar114 = ZEXT1664(CONCAT412(uVar52,CONCAT48(uVar52,CONCAT44(uVar52,uVar52))));
      auVar47 = vmovshdup_avx(auVar79);
      auVar87 = vshufps_avx(auVar79,auVar79,0x55);
      auVar120 = ZEXT1664(auVar87);
      auVar87 = vshufpd_avx(auVar79,auVar79,1);
      auVar88 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar85 = ZEXT1664(auVar88);
      auVar88 = vshufps_avx(auVar68,auVar68,0x55);
      auVar123 = ZEXT1664(auVar88);
      uVar37 = (ulong)(auVar79._0_4_ < 0.0) << 4;
      auVar88 = vshufps_avx(auVar68,auVar68,0xaa);
      auVar72 = ZEXT1664(auVar88);
      uVar41 = (ulong)(auVar47._0_4_ < 0.0) << 4 | 0x20;
      uVar39 = (ulong)(auVar87._0_4_ < 0.0) << 4 | 0x40;
      uVar43 = uVar37 ^ 0x10;
      uVar44 = uVar41 ^ 0x10;
      uVar52 = auVar46._0_4_;
      auVar93 = ZEXT1664(CONCAT412(uVar52,CONCAT48(uVar52,CONCAT44(uVar52,uVar52))));
      auVar100 = ZEXT1664(CONCAT412(fVar97,CONCAT48(fVar97,CONCAT44(fVar97,fVar97))));
      auVar91._16_16_ = mm_lookupmask_ps._240_16_;
      auVar91._0_16_ = mm_lookupmask_ps._0_16_;
      auVar131 = ZEXT3264(auVar91);
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar56._16_4_ = 0x3f800000;
      auVar56._20_4_ = 0x3f800000;
      auVar56._24_4_ = 0x3f800000;
      auVar56._28_4_ = 0x3f800000;
      auVar48._8_4_ = 0xbf800000;
      auVar48._0_8_ = 0xbf800000bf800000;
      auVar48._12_4_ = 0xbf800000;
      auVar48._16_4_ = 0xbf800000;
      auVar48._20_4_ = 0xbf800000;
      auVar48._24_4_ = 0xbf800000;
      auVar48._28_4_ = 0xbf800000;
      _local_a20 = vblendvps_avx(auVar56,auVar48,auVar91);
      fVar97 = auVar79._0_4_;
      fVar101 = auVar79._0_4_;
      fVar102 = auVar79._0_4_;
      fVar103 = auVar68._0_4_;
      fVar104 = auVar68._0_4_;
      fVar105 = auVar68._0_4_;
      do {
        uVar42 = puVar40[-1];
        puVar40 = puVar40 + -1;
        local_c80 = auVar107._0_16_;
        local_c90 = auVar111._0_16_;
        local_ca0 = auVar114._0_16_;
        while ((uVar42 & 8) == 0) {
          auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar37),local_c80);
          auVar46._0_4_ = auVar79._0_4_ * auVar47._0_4_;
          auVar46._4_4_ = fVar97 * auVar47._4_4_;
          auVar46._8_4_ = fVar101 * auVar47._8_4_;
          auVar46._12_4_ = fVar102 * auVar47._12_4_;
          auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar41),local_c90);
          auVar53._0_4_ = auVar120._0_4_ * auVar47._0_4_;
          auVar53._4_4_ = auVar120._4_4_ * auVar47._4_4_;
          auVar53._8_4_ = auVar120._8_4_ * auVar47._8_4_;
          auVar53._12_4_ = auVar120._12_4_ * auVar47._12_4_;
          auVar47 = vmaxps_avx(auVar46,auVar53);
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar39),local_ca0);
          auVar54._0_4_ = auVar85._0_4_ * auVar87._0_4_;
          auVar54._4_4_ = auVar85._4_4_ * auVar87._4_4_;
          auVar54._8_4_ = auVar85._8_4_ * auVar87._8_4_;
          auVar54._12_4_ = auVar85._12_4_ * auVar87._12_4_;
          auVar87 = vmaxps_avx(auVar54,auVar93._0_16_);
          auVar47 = vmaxps_avx(auVar47,auVar87);
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar43),local_c80);
          auVar55._0_4_ = auVar68._0_4_ * auVar87._0_4_;
          auVar55._4_4_ = fVar103 * auVar87._4_4_;
          auVar55._8_4_ = fVar104 * auVar87._8_4_;
          auVar55._12_4_ = fVar105 * auVar87._12_4_;
          auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar44),local_c90);
          auVar60._0_4_ = auVar123._0_4_ * auVar87._0_4_;
          auVar60._4_4_ = auVar123._4_4_ * auVar87._4_4_;
          auVar60._8_4_ = auVar123._8_4_ * auVar87._8_4_;
          auVar60._12_4_ = auVar123._12_4_ * auVar87._12_4_;
          auVar87 = vminps_avx(auVar55,auVar60);
          auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar39 ^ 0x10)),local_ca0);
          auVar61._0_4_ = auVar72._0_4_ * auVar46._0_4_;
          auVar61._4_4_ = auVar72._4_4_ * auVar46._4_4_;
          auVar61._8_4_ = auVar72._8_4_ * auVar46._8_4_;
          auVar61._12_4_ = auVar72._12_4_ * auVar46._12_4_;
          auVar46 = vminps_avx(auVar61,auVar100._0_16_);
          auVar87 = vminps_avx(auVar87,auVar46);
          auVar47 = vcmpps_avx(auVar47,auVar87,2);
          uVar34 = vmovmskps_avx(auVar47);
          if (uVar34 == 0) goto LAB_004bbac8;
          uVar32 = uVar42 & 0xfffffffffffffff0;
          lVar38 = 0;
          for (uVar42 = (ulong)(byte)uVar34; (uVar42 & 1) == 0;
              uVar42 = uVar42 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar42 = *(ulong *)(uVar32 + lVar38 * 8);
          uVar34 = (uVar34 & 0xff) - 1 & uVar34 & 0xff;
          uVar35 = (ulong)uVar34;
          if (uVar34 != 0) {
            *puVar40 = uVar42;
            lVar38 = 0;
            for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
            uVar34 = uVar34 - 1 & uVar34;
            uVar35 = (ulong)uVar34;
            bVar45 = uVar34 == 0;
            while( true ) {
              puVar40 = puVar40 + 1;
              uVar42 = *(ulong *)(uVar32 + lVar38 * 8);
              if (bVar45) break;
              *puVar40 = uVar42;
              lVar38 = 0;
              for (uVar42 = uVar35; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
                lVar38 = lVar38 + 1;
              }
              uVar35 = uVar35 - 1 & uVar35;
              bVar45 = uVar35 == 0;
            }
          }
        }
        local_c68 = (ulong)((uint)uVar42 & 0xf) - 8;
        if (local_c68 != 0) {
          uVar42 = uVar42 & 0xfffffffffffffff0;
          lVar38 = 0;
          local_cb0 = auVar79._0_4_;
          fStack_cac = fVar97;
          fStack_ca8 = fVar101;
          fStack_ca4 = fVar102;
          local_cc0 = auVar120._0_16_;
          local_cd0 = auVar85._0_16_;
          local_ce0 = auVar68._0_4_;
          fStack_cdc = fVar103;
          fStack_cd8 = fVar104;
          fStack_cd4 = fVar105;
          local_cf0 = auVar123._0_16_;
          local_d00 = auVar72._0_16_;
          local_d10 = auVar93._0_16_;
          local_d20 = auVar100._0_16_;
          local_aa0 = auVar131._0_32_;
          do {
            lVar33 = lVar38 * 0xe0;
            lVar1 = uVar42 + 0xd0 + lVar33;
            local_a00 = *(undefined8 *)(lVar1 + 0x10);
            uStack_9f8 = *(undefined8 *)(lVar1 + 0x18);
            lVar1 = uVar42 + 0xc0 + lVar33;
            local_9e0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_9d8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_9d0 = local_9e0;
            uStack_9c8 = uStack_9d8;
            uStack_9f0 = local_a00;
            uStack_9e8 = uStack_9f8;
            auVar49._16_16_ = *(undefined1 (*) [16])(uVar42 + 0x60 + lVar33);
            auVar49._0_16_ = *(undefined1 (*) [16])(uVar42 + lVar33);
            auVar57._16_16_ = *(undefined1 (*) [16])(uVar42 + 0x70 + lVar33);
            auVar57._0_16_ = *(undefined1 (*) [16])(uVar42 + 0x10 + lVar33);
            auVar62._16_16_ = *(undefined1 (*) [16])(uVar42 + 0x80 + lVar33);
            auVar62._0_16_ = *(undefined1 (*) [16])(uVar42 + 0x20 + lVar33);
            auVar47 = *(undefined1 (*) [16])(uVar42 + 0x30 + lVar33);
            auVar69._16_16_ = auVar47;
            auVar69._0_16_ = auVar47;
            auVar47 = *(undefined1 (*) [16])(uVar42 + 0x40 + lVar33);
            auVar80._16_16_ = auVar47;
            auVar80._0_16_ = auVar47;
            auVar47 = *(undefined1 (*) [16])(uVar42 + 0x50 + lVar33);
            auVar106._16_16_ = auVar47;
            auVar106._0_16_ = auVar47;
            auVar47 = *(undefined1 (*) [16])(uVar42 + 0x90 + lVar33);
            auVar98._16_16_ = auVar47;
            auVar98._0_16_ = auVar47;
            auVar47 = *(undefined1 (*) [16])(uVar42 + 0xa0 + lVar33);
            auVar108._16_16_ = auVar47;
            auVar108._0_16_ = auVar47;
            auVar47 = *(undefined1 (*) [16])(uVar42 + 0xb0 + lVar33);
            auVar132._16_16_ = auVar47;
            auVar132._0_16_ = auVar47;
            uVar52 = *(undefined4 *)&(ray->org).field_0;
            auVar118._4_4_ = uVar52;
            auVar118._0_4_ = uVar52;
            auVar118._8_4_ = uVar52;
            auVar118._12_4_ = uVar52;
            auVar118._16_4_ = uVar52;
            auVar118._20_4_ = uVar52;
            auVar118._24_4_ = uVar52;
            auVar118._28_4_ = uVar52;
            uVar52 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar122._4_4_ = uVar52;
            auVar122._0_4_ = uVar52;
            auVar122._8_4_ = uVar52;
            auVar122._12_4_ = uVar52;
            auVar122._16_4_ = uVar52;
            auVar122._20_4_ = uVar52;
            auVar122._24_4_ = uVar52;
            auVar122._28_4_ = uVar52;
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar130._4_4_ = uVar2;
            auVar130._0_4_ = uVar2;
            auVar130._8_4_ = uVar2;
            auVar130._12_4_ = uVar2;
            auVar130._16_4_ = uVar2;
            auVar130._20_4_ = uVar2;
            auVar130._24_4_ = uVar2;
            auVar130._28_4_ = uVar2;
            local_ac0 = vsubps_avx(auVar49,auVar118);
            local_ba0 = vsubps_avx(auVar57,auVar122);
            local_ae0 = vsubps_avx(auVar62,auVar130);
            auVar48 = vsubps_avx(auVar69,auVar118);
            auVar56 = vsubps_avx(auVar80,auVar122);
            auVar91 = vsubps_avx(auVar106,auVar130);
            auVar49 = vsubps_avx(auVar98,auVar118);
            auVar57 = vsubps_avx(auVar108,auVar122);
            auVar13 = vsubps_avx(auVar132,auVar130);
            local_b00 = vsubps_avx(auVar49,local_ac0);
            local_b40 = vsubps_avx(auVar57,local_ba0);
            local_b20 = vsubps_avx(auVar13,local_ae0);
            auVar50._0_4_ = auVar49._0_4_ + local_ac0._0_4_;
            auVar50._4_4_ = auVar49._4_4_ + local_ac0._4_4_;
            auVar50._8_4_ = auVar49._8_4_ + local_ac0._8_4_;
            auVar50._12_4_ = auVar49._12_4_ + local_ac0._12_4_;
            auVar50._16_4_ = auVar49._16_4_ + local_ac0._16_4_;
            auVar50._20_4_ = auVar49._20_4_ + local_ac0._20_4_;
            auVar50._24_4_ = auVar49._24_4_ + local_ac0._24_4_;
            auVar50._28_4_ = auVar49._28_4_ + local_ac0._28_4_;
            auVar70._0_4_ = auVar57._0_4_ + local_ba0._0_4_;
            auVar70._4_4_ = auVar57._4_4_ + local_ba0._4_4_;
            auVar70._8_4_ = auVar57._8_4_ + local_ba0._8_4_;
            auVar70._12_4_ = auVar57._12_4_ + local_ba0._12_4_;
            auVar70._16_4_ = auVar57._16_4_ + local_ba0._16_4_;
            auVar70._20_4_ = auVar57._20_4_ + local_ba0._20_4_;
            auVar70._24_4_ = auVar57._24_4_ + local_ba0._24_4_;
            auVar70._28_4_ = auVar57._28_4_ + local_ba0._28_4_;
            fVar6 = local_ae0._0_4_;
            auVar81._0_4_ = auVar13._0_4_ + fVar6;
            fVar7 = local_ae0._4_4_;
            auVar81._4_4_ = auVar13._4_4_ + fVar7;
            fVar8 = local_ae0._8_4_;
            auVar81._8_4_ = auVar13._8_4_ + fVar8;
            fVar9 = local_ae0._12_4_;
            auVar81._12_4_ = auVar13._12_4_ + fVar9;
            fVar10 = local_ae0._16_4_;
            auVar81._16_4_ = auVar13._16_4_ + fVar10;
            fVar11 = local_ae0._20_4_;
            auVar81._20_4_ = auVar13._20_4_ + fVar11;
            fVar12 = local_ae0._24_4_;
            auVar81._24_4_ = auVar13._24_4_ + fVar12;
            auVar81._28_4_ = auVar13._28_4_ + local_ae0._28_4_;
            auVar14._4_4_ = local_b20._4_4_ * auVar70._4_4_;
            auVar14._0_4_ = local_b20._0_4_ * auVar70._0_4_;
            auVar14._8_4_ = local_b20._8_4_ * auVar70._8_4_;
            auVar14._12_4_ = local_b20._12_4_ * auVar70._12_4_;
            auVar14._16_4_ = local_b20._16_4_ * auVar70._16_4_;
            auVar14._20_4_ = local_b20._20_4_ * auVar70._20_4_;
            auVar14._24_4_ = local_b20._24_4_ * auVar70._24_4_;
            auVar14._28_4_ = uVar52;
            auVar87 = vfmsub231ps_fma(auVar14,local_b40,auVar81);
            auVar15._4_4_ = auVar81._4_4_ * local_b00._4_4_;
            auVar15._0_4_ = auVar81._0_4_ * local_b00._0_4_;
            auVar15._8_4_ = auVar81._8_4_ * local_b00._8_4_;
            auVar15._12_4_ = auVar81._12_4_ * local_b00._12_4_;
            auVar15._16_4_ = auVar81._16_4_ * local_b00._16_4_;
            auVar15._20_4_ = auVar81._20_4_ * local_b00._20_4_;
            auVar15._24_4_ = auVar81._24_4_ * local_b00._24_4_;
            auVar15._28_4_ = auVar81._28_4_;
            auVar47 = vfmsub231ps_fma(auVar15,local_b20,auVar50);
            auVar17._4_4_ = local_b40._4_4_ * auVar50._4_4_;
            auVar17._0_4_ = local_b40._0_4_ * auVar50._0_4_;
            auVar17._8_4_ = local_b40._8_4_ * auVar50._8_4_;
            auVar17._12_4_ = local_b40._12_4_ * auVar50._12_4_;
            auVar17._16_4_ = local_b40._16_4_ * auVar50._16_4_;
            auVar17._20_4_ = local_b40._20_4_ * auVar50._20_4_;
            auVar17._24_4_ = local_b40._24_4_ * auVar50._24_4_;
            auVar17._28_4_ = auVar50._28_4_;
            auVar46 = vfmsub231ps_fma(auVar17,local_b00,auVar70);
            uVar52 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
            local_c40._4_4_ = uVar52;
            local_c40._0_4_ = uVar52;
            local_c40._8_4_ = uVar52;
            local_c40._12_4_ = uVar52;
            local_c40._16_4_ = uVar52;
            local_c40._20_4_ = uVar52;
            local_c40._24_4_ = uVar52;
            local_c40._28_4_ = uVar52;
            fVar3 = (ray->dir).field_0.m128[2];
            local_bc0._4_4_ = fVar3;
            local_bc0._0_4_ = fVar3;
            local_bc0._8_4_ = fVar3;
            local_bc0._12_4_ = fVar3;
            local_bc0._16_4_ = fVar3;
            local_bc0._20_4_ = fVar3;
            local_bc0._24_4_ = fVar3;
            local_bc0._28_4_ = fVar3;
            auVar51._0_4_ = fVar3 * auVar46._0_4_;
            auVar51._4_4_ = fVar3 * auVar46._4_4_;
            auVar51._8_4_ = fVar3 * auVar46._8_4_;
            auVar51._12_4_ = fVar3 * auVar46._12_4_;
            auVar51._16_4_ = fVar3 * 0.0;
            auVar51._20_4_ = fVar3 * 0.0;
            auVar51._24_4_ = fVar3 * 0.0;
            auVar51._28_4_ = 0;
            auVar47 = vfmadd231ps_fma(auVar51,local_c40,ZEXT1632(auVar47));
            uVar52 = *(undefined4 *)&(ray->dir).field_0;
            local_b80._4_4_ = uVar52;
            local_b80._0_4_ = uVar52;
            local_b80._8_4_ = uVar52;
            local_b80._12_4_ = uVar52;
            local_b80._16_4_ = uVar52;
            local_b80._20_4_ = uVar52;
            local_b80._24_4_ = uVar52;
            local_b80._28_4_ = uVar52;
            auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),local_b80,ZEXT1632(auVar87));
            local_b60 = vsubps_avx(local_ba0,auVar56);
            local_a40 = vsubps_avx(local_ae0,auVar91);
            auVar71._0_4_ = local_ba0._0_4_ + auVar56._0_4_;
            auVar71._4_4_ = local_ba0._4_4_ + auVar56._4_4_;
            auVar71._8_4_ = local_ba0._8_4_ + auVar56._8_4_;
            auVar71._12_4_ = local_ba0._12_4_ + auVar56._12_4_;
            auVar71._16_4_ = local_ba0._16_4_ + auVar56._16_4_;
            auVar71._20_4_ = local_ba0._20_4_ + auVar56._20_4_;
            auVar71._24_4_ = local_ba0._24_4_ + auVar56._24_4_;
            auVar71._28_4_ = local_ba0._28_4_ + auVar56._28_4_;
            auVar82._0_4_ = auVar91._0_4_ + fVar6;
            auVar82._4_4_ = auVar91._4_4_ + fVar7;
            auVar82._8_4_ = auVar91._8_4_ + fVar8;
            auVar82._12_4_ = auVar91._12_4_ + fVar9;
            auVar82._16_4_ = auVar91._16_4_ + fVar10;
            auVar82._20_4_ = auVar91._20_4_ + fVar11;
            auVar82._24_4_ = auVar91._24_4_ + fVar12;
            auVar82._28_4_ = auVar91._28_4_ + local_ae0._28_4_;
            fVar121 = local_a40._0_4_;
            fVar124 = local_a40._4_4_;
            auVar18._4_4_ = fVar124 * auVar71._4_4_;
            auVar18._0_4_ = fVar121 * auVar71._0_4_;
            fVar125 = local_a40._8_4_;
            auVar18._8_4_ = fVar125 * auVar71._8_4_;
            fVar126 = local_a40._12_4_;
            auVar18._12_4_ = fVar126 * auVar71._12_4_;
            fVar127 = local_a40._16_4_;
            auVar18._16_4_ = fVar127 * auVar71._16_4_;
            fVar128 = local_a40._20_4_;
            auVar18._20_4_ = fVar128 * auVar71._20_4_;
            fVar129 = local_a40._24_4_;
            auVar18._24_4_ = fVar129 * auVar71._24_4_;
            auVar18._28_4_ = local_b00._28_4_;
            auVar46 = vfmsub231ps_fma(auVar18,local_b60,auVar82);
            auVar14 = vsubps_avx(local_ac0,auVar48);
            fVar67 = auVar14._0_4_;
            fVar73 = auVar14._4_4_;
            auVar19._4_4_ = auVar82._4_4_ * fVar73;
            auVar19._0_4_ = auVar82._0_4_ * fVar67;
            fVar74 = auVar14._8_4_;
            auVar19._8_4_ = auVar82._8_4_ * fVar74;
            fVar75 = auVar14._12_4_;
            auVar19._12_4_ = auVar82._12_4_ * fVar75;
            fVar76 = auVar14._16_4_;
            auVar19._16_4_ = auVar82._16_4_ * fVar76;
            fVar77 = auVar14._20_4_;
            auVar19._20_4_ = auVar82._20_4_ * fVar77;
            fVar78 = auVar14._24_4_;
            auVar19._24_4_ = auVar82._24_4_ * fVar78;
            auVar19._28_4_ = local_b20._28_4_;
            auVar83._0_4_ = auVar48._0_4_ + local_ac0._0_4_;
            auVar83._4_4_ = auVar48._4_4_ + local_ac0._4_4_;
            auVar83._8_4_ = auVar48._8_4_ + local_ac0._8_4_;
            auVar83._12_4_ = auVar48._12_4_ + local_ac0._12_4_;
            auVar83._16_4_ = auVar48._16_4_ + local_ac0._16_4_;
            auVar83._20_4_ = auVar48._20_4_ + local_ac0._20_4_;
            auVar83._24_4_ = auVar48._24_4_ + local_ac0._24_4_;
            auVar83._28_4_ = auVar48._28_4_ + local_ac0._28_4_;
            auVar87 = vfmsub231ps_fma(auVar19,local_a40,auVar83);
            fVar86 = local_b60._0_4_;
            fVar94 = local_b60._4_4_;
            auVar20._4_4_ = fVar94 * auVar83._4_4_;
            auVar20._0_4_ = fVar86 * auVar83._0_4_;
            fVar95 = local_b60._8_4_;
            auVar20._8_4_ = fVar95 * auVar83._8_4_;
            fVar96 = local_b60._12_4_;
            auVar20._12_4_ = fVar96 * auVar83._12_4_;
            fVar115 = local_b60._16_4_;
            auVar20._16_4_ = fVar115 * auVar83._16_4_;
            fVar116 = local_b60._20_4_;
            auVar20._20_4_ = fVar116 * auVar83._20_4_;
            fVar117 = local_b60._24_4_;
            auVar20._24_4_ = fVar117 * auVar83._24_4_;
            auVar20._28_4_ = auVar83._28_4_;
            auVar88 = vfmsub231ps_fma(auVar20,auVar14,auVar71);
            auVar84._0_4_ = fVar3 * auVar88._0_4_;
            auVar84._4_4_ = fVar3 * auVar88._4_4_;
            auVar84._8_4_ = fVar3 * auVar88._8_4_;
            auVar84._12_4_ = fVar3 * auVar88._12_4_;
            auVar84._16_4_ = fVar3 * 0.0;
            auVar84._20_4_ = fVar3 * 0.0;
            auVar84._24_4_ = fVar3 * 0.0;
            auVar84._28_4_ = 0;
            auVar87 = vfmadd231ps_fma(auVar84,local_c40,ZEXT1632(auVar87));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_b80,ZEXT1632(auVar46));
            auVar15 = vsubps_avx(auVar48,auVar49);
            auVar63._0_4_ = auVar48._0_4_ + auVar49._0_4_;
            auVar63._4_4_ = auVar48._4_4_ + auVar49._4_4_;
            auVar63._8_4_ = auVar48._8_4_ + auVar49._8_4_;
            auVar63._12_4_ = auVar48._12_4_ + auVar49._12_4_;
            auVar63._16_4_ = auVar48._16_4_ + auVar49._16_4_;
            auVar63._20_4_ = auVar48._20_4_ + auVar49._20_4_;
            auVar63._24_4_ = auVar48._24_4_ + auVar49._24_4_;
            auVar63._28_4_ = auVar48._28_4_ + auVar49._28_4_;
            auVar49 = vsubps_avx(auVar56,auVar57);
            auVar90._0_4_ = auVar56._0_4_ + auVar57._0_4_;
            auVar90._4_4_ = auVar56._4_4_ + auVar57._4_4_;
            auVar90._8_4_ = auVar56._8_4_ + auVar57._8_4_;
            auVar90._12_4_ = auVar56._12_4_ + auVar57._12_4_;
            auVar90._16_4_ = auVar56._16_4_ + auVar57._16_4_;
            auVar90._20_4_ = auVar56._20_4_ + auVar57._20_4_;
            auVar90._24_4_ = auVar56._24_4_ + auVar57._24_4_;
            auVar90._28_4_ = auVar56._28_4_ + auVar57._28_4_;
            auVar57 = vsubps_avx(auVar91,auVar13);
            auVar58._0_4_ = auVar91._0_4_ + auVar13._0_4_;
            auVar58._4_4_ = auVar91._4_4_ + auVar13._4_4_;
            auVar58._8_4_ = auVar91._8_4_ + auVar13._8_4_;
            auVar58._12_4_ = auVar91._12_4_ + auVar13._12_4_;
            auVar58._16_4_ = auVar91._16_4_ + auVar13._16_4_;
            auVar58._20_4_ = auVar91._20_4_ + auVar13._20_4_;
            auVar58._24_4_ = auVar91._24_4_ + auVar13._24_4_;
            auVar58._28_4_ = auVar91._28_4_ + auVar13._28_4_;
            auVar99._0_4_ = auVar57._0_4_ * auVar90._0_4_;
            auVar99._4_4_ = auVar57._4_4_ * auVar90._4_4_;
            auVar99._8_4_ = auVar57._8_4_ * auVar90._8_4_;
            auVar99._12_4_ = auVar57._12_4_ * auVar90._12_4_;
            auVar99._16_4_ = auVar57._16_4_ * auVar90._16_4_;
            auVar99._20_4_ = auVar57._20_4_ * auVar90._20_4_;
            auVar99._24_4_ = auVar57._24_4_ * auVar90._24_4_;
            auVar99._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar99,auVar49,auVar58);
            auVar13._4_4_ = auVar58._4_4_ * auVar15._4_4_;
            auVar13._0_4_ = auVar58._0_4_ * auVar15._0_4_;
            auVar13._8_4_ = auVar58._8_4_ * auVar15._8_4_;
            auVar13._12_4_ = auVar58._12_4_ * auVar15._12_4_;
            auVar13._16_4_ = auVar58._16_4_ * auVar15._16_4_;
            auVar13._20_4_ = auVar58._20_4_ * auVar15._20_4_;
            auVar13._24_4_ = auVar58._24_4_ * auVar15._24_4_;
            auVar13._28_4_ = auVar58._28_4_;
            auVar46 = vfmsub231ps_fma(auVar13,auVar57,auVar63);
            auVar21._4_4_ = auVar49._4_4_ * auVar63._4_4_;
            auVar21._0_4_ = auVar49._0_4_ * auVar63._0_4_;
            auVar21._8_4_ = auVar49._8_4_ * auVar63._8_4_;
            auVar21._12_4_ = auVar49._12_4_ * auVar63._12_4_;
            auVar21._16_4_ = auVar49._16_4_ * auVar63._16_4_;
            auVar21._20_4_ = auVar49._20_4_ * auVar63._20_4_;
            auVar21._24_4_ = auVar49._24_4_ * auVar63._24_4_;
            auVar21._28_4_ = auVar63._28_4_;
            auVar68 = vfmsub231ps_fma(auVar21,auVar15,auVar90);
            auVar64._0_4_ = fVar3 * auVar68._0_4_;
            auVar64._4_4_ = fVar3 * auVar68._4_4_;
            auVar64._8_4_ = fVar3 * auVar68._8_4_;
            auVar64._12_4_ = fVar3 * auVar68._12_4_;
            auVar64._16_4_ = fVar3 * 0.0;
            auVar64._20_4_ = fVar3 * 0.0;
            auVar64._24_4_ = fVar3 * 0.0;
            auVar64._28_4_ = 0;
            auVar46 = vfmadd231ps_fma(auVar64,local_c40,ZEXT1632(auVar46));
            auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),local_b80,ZEXT1632(auVar88));
            local_9c0 = auVar47._0_4_;
            fStack_9bc = auVar47._4_4_;
            fStack_9b8 = auVar47._8_4_;
            fStack_9b4 = auVar47._12_4_;
            local_980 = ZEXT1632(CONCAT412(auVar46._12_4_ + fStack_9b4 + auVar87._12_4_,
                                           CONCAT48(auVar46._8_4_ + fStack_9b8 + auVar87._8_4_,
                                                    CONCAT44(auVar46._4_4_ +
                                                             fStack_9bc + auVar87._4_4_,
                                                             auVar46._0_4_ +
                                                             local_9c0 + auVar87._0_4_))));
            auVar59._8_4_ = 0x7fffffff;
            auVar59._0_8_ = 0x7fffffff7fffffff;
            auVar59._12_4_ = 0x7fffffff;
            auVar59._16_4_ = 0x7fffffff;
            auVar59._20_4_ = 0x7fffffff;
            auVar59._24_4_ = 0x7fffffff;
            auVar59._28_4_ = 0x7fffffff;
            local_c60 = ZEXT1632(auVar47);
            auVar48 = vminps_avx(local_c60,ZEXT1632(auVar87));
            auVar48 = vminps_avx(auVar48,ZEXT1632(auVar46));
            local_a60 = vandps_avx(local_980,auVar59);
            fVar97 = local_a60._0_4_ * 1.1920929e-07;
            fVar101 = local_a60._4_4_ * 1.1920929e-07;
            auVar22._4_4_ = fVar101;
            auVar22._0_4_ = fVar97;
            fVar102 = local_a60._8_4_ * 1.1920929e-07;
            auVar22._8_4_ = fVar102;
            auVar79._0_4_ = local_a60._12_4_ * 1.1920929e-07;
            auVar22._12_4_ = auVar79._0_4_;
            fVar103 = local_a60._16_4_ * 1.1920929e-07;
            auVar22._16_4_ = fVar103;
            fVar104 = local_a60._20_4_ * 1.1920929e-07;
            auVar22._20_4_ = fVar104;
            fVar105 = local_a60._24_4_ * 1.1920929e-07;
            auVar22._24_4_ = fVar105;
            auVar22._28_4_ = 0x34000000;
            auVar109._0_8_ = CONCAT44(fVar101,fVar97) ^ 0x8000000080000000;
            auVar109._8_4_ = -fVar102;
            auVar109._12_4_ = -auVar79._0_4_;
            auVar109._16_4_ = -fVar103;
            auVar109._20_4_ = -fVar104;
            auVar109._24_4_ = -fVar105;
            auVar109._28_4_ = 0xb4000000;
            auVar48 = vcmpps_avx(auVar48,auVar109,5);
            auVar91 = vmaxps_avx(local_c60,ZEXT1632(auVar87));
            auVar56 = vmaxps_avx(auVar91,ZEXT1632(auVar46));
            auVar56 = vcmpps_avx(auVar56,auVar22,2);
            auVar56 = vorps_avx(auVar48,auVar56);
            fVar97 = fStack_cac;
            fVar101 = fStack_ca8;
            fVar102 = fStack_ca4;
            auVar79._0_4_ = local_cb0;
            fVar103 = fStack_cdc;
            fVar104 = fStack_cd8;
            fVar105 = fStack_cd4;
            auVar68._0_4_ = local_ce0;
            if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar56 >> 0x7f,0) == '\0') &&
                  (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar56 >> 0xbf,0) == '\0') &&
                (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar56[0x1f]) {
LAB_004bba5a:
              auVar107 = ZEXT1664(local_c80);
              auVar111 = ZEXT1664(local_c90);
              auVar114 = ZEXT1664(local_ca0);
              auVar120 = ZEXT1664(local_cc0);
              auVar85 = ZEXT1664(local_cd0);
              auVar123 = ZEXT1664(local_cf0);
              auVar72 = ZEXT1664(local_d00);
              auVar93 = ZEXT1664(local_d10);
              auVar100 = ZEXT1664(local_d20);
              auVar131 = ZEXT3264(local_aa0);
            }
            else {
              auVar23._4_4_ = fVar94 * local_b20._4_4_;
              auVar23._0_4_ = fVar86 * local_b20._0_4_;
              auVar23._8_4_ = fVar95 * local_b20._8_4_;
              auVar23._12_4_ = fVar96 * local_b20._12_4_;
              auVar23._16_4_ = fVar115 * local_b20._16_4_;
              auVar23._20_4_ = fVar116 * local_b20._20_4_;
              auVar23._24_4_ = fVar117 * local_b20._24_4_;
              auVar23._28_4_ = auVar48._28_4_;
              local_a80 = 0x80000000;
              uStack_a7c = 0x80000000;
              uStack_a78 = 0x80000000;
              uStack_a74 = 0x80000000;
              uStack_a70 = 0x80000000;
              uStack_a6c = 0x80000000;
              uStack_a68 = 0x80000000;
              uStack_a64 = 0x80000000;
              auVar24._4_4_ = local_b40._4_4_ * fVar73;
              auVar24._0_4_ = local_b40._0_4_ * fVar67;
              auVar24._8_4_ = local_b40._8_4_ * fVar74;
              auVar24._12_4_ = local_b40._12_4_ * fVar75;
              auVar24._16_4_ = local_b40._16_4_ * fVar76;
              auVar24._20_4_ = local_b40._20_4_ * fVar77;
              auVar24._24_4_ = local_b40._24_4_ * fVar78;
              auVar24._28_4_ = auVar91._28_4_;
              auVar47 = vfmsub213ps_fma(local_b40,local_a40,auVar23);
              auVar25._4_4_ = fVar124 * auVar49._4_4_;
              auVar25._0_4_ = fVar121 * auVar49._0_4_;
              auVar25._8_4_ = fVar125 * auVar49._8_4_;
              auVar25._12_4_ = fVar126 * auVar49._12_4_;
              auVar25._16_4_ = fVar127 * auVar49._16_4_;
              auVar25._20_4_ = fVar128 * auVar49._20_4_;
              auVar25._24_4_ = fVar129 * auVar49._24_4_;
              auVar25._28_4_ = 0x34000000;
              auVar26._4_4_ = fVar73 * auVar57._4_4_;
              auVar26._0_4_ = fVar67 * auVar57._0_4_;
              auVar26._8_4_ = fVar74 * auVar57._8_4_;
              auVar26._12_4_ = fVar75 * auVar57._12_4_;
              auVar26._16_4_ = fVar76 * auVar57._16_4_;
              auVar26._20_4_ = fVar77 * auVar57._20_4_;
              auVar26._24_4_ = fVar78 * auVar57._24_4_;
              auVar26._28_4_ = auVar14._28_4_;
              auVar46 = vfmsub213ps_fma(auVar57,local_b60,auVar25);
              auVar48 = vandps_avx(auVar23,auVar59);
              auVar91 = vandps_avx(auVar25,auVar59);
              auVar48 = vcmpps_avx(auVar48,auVar91,1);
              local_960 = vblendvps_avx(ZEXT1632(auVar46),ZEXT1632(auVar47),auVar48);
              auVar27._4_4_ = fVar94 * auVar15._4_4_;
              auVar27._0_4_ = fVar86 * auVar15._0_4_;
              auVar27._8_4_ = fVar95 * auVar15._8_4_;
              auVar27._12_4_ = fVar96 * auVar15._12_4_;
              auVar27._16_4_ = fVar115 * auVar15._16_4_;
              auVar27._20_4_ = fVar116 * auVar15._20_4_;
              auVar27._24_4_ = fVar117 * auVar15._24_4_;
              auVar27._28_4_ = auVar48._28_4_;
              auVar47 = vfmsub213ps_fma(auVar15,local_a40,auVar26);
              auVar28._4_4_ = local_b00._4_4_ * fVar124;
              auVar28._0_4_ = local_b00._0_4_ * fVar121;
              auVar28._8_4_ = local_b00._8_4_ * fVar125;
              auVar28._12_4_ = local_b00._12_4_ * fVar126;
              auVar28._16_4_ = local_b00._16_4_ * fVar127;
              auVar28._20_4_ = local_b00._20_4_ * fVar128;
              auVar28._24_4_ = local_b00._24_4_ * fVar129;
              auVar28._28_4_ = auVar91._28_4_;
              auVar46 = vfmsub213ps_fma(local_b20,auVar14,auVar28);
              auVar48 = vandps_avx(auVar28,auVar59);
              auVar91 = vandps_avx(auVar26,auVar59);
              auVar48 = vcmpps_avx(auVar48,auVar91,1);
              local_940 = vblendvps_avx(ZEXT1632(auVar47),ZEXT1632(auVar46),auVar48);
              auVar47 = vfmsub213ps_fma(local_b00,local_b60,auVar24);
              auVar46 = vfmsub213ps_fma(auVar49,auVar14,auVar27);
              auVar48 = vandps_avx(auVar24,auVar59);
              auVar91 = vandps_avx(auVar27,auVar59);
              auVar48 = vcmpps_avx(auVar48,auVar91,1);
              local_920 = vblendvps_avx(ZEXT1632(auVar46),ZEXT1632(auVar47),auVar48);
              auVar47 = vpackssdw_avx(auVar56._0_16_,auVar56._16_16_);
              fVar67 = local_920._0_4_;
              fVar73 = local_920._4_4_;
              auVar29._4_4_ = fVar73 * fVar3;
              auVar29._0_4_ = fVar67 * fVar3;
              fVar74 = local_920._8_4_;
              auVar29._8_4_ = fVar74 * fVar3;
              fVar75 = local_920._12_4_;
              auVar29._12_4_ = fVar75 * fVar3;
              fVar76 = local_920._16_4_;
              auVar29._16_4_ = fVar76 * fVar3;
              fVar77 = local_920._20_4_;
              auVar29._20_4_ = fVar77 * fVar3;
              fVar78 = local_920._24_4_;
              auVar29._24_4_ = fVar78 * fVar3;
              auVar29._28_4_ = auVar56._28_4_;
              auVar46 = vfmadd213ps_fma(local_c40,local_940,auVar29);
              auVar46 = vfmadd213ps_fma(local_b80,local_960,ZEXT1632(auVar46));
              fVar86 = auVar46._0_4_ + auVar46._0_4_;
              fVar94 = auVar46._4_4_ + auVar46._4_4_;
              fVar95 = auVar46._8_4_ + auVar46._8_4_;
              fVar96 = auVar46._12_4_ + auVar46._12_4_;
              auVar91 = ZEXT1632(CONCAT412(fVar96,CONCAT48(fVar95,CONCAT44(fVar94,fVar86))));
              auVar65._0_4_ = fVar67 * fVar6;
              auVar65._4_4_ = fVar73 * fVar7;
              auVar65._8_4_ = fVar74 * fVar8;
              auVar65._12_4_ = fVar75 * fVar9;
              auVar65._16_4_ = fVar76 * fVar10;
              auVar65._20_4_ = fVar77 * fVar11;
              auVar65._24_4_ = fVar78 * fVar12;
              auVar65._28_4_ = 0;
              auVar46 = vfmadd213ps_fma(local_ba0,local_940,auVar65);
              auVar88 = vfmadd213ps_fma(local_ac0,local_960,ZEXT1632(auVar46));
              auVar48 = vrcpps_avx(auVar91);
              auVar119._8_4_ = 0x3f800000;
              auVar119._0_8_ = 0x3f8000003f800000;
              auVar119._12_4_ = 0x3f800000;
              auVar119._16_4_ = 0x3f800000;
              auVar119._20_4_ = 0x3f800000;
              auVar119._24_4_ = 0x3f800000;
              auVar119._28_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_fma(auVar48,auVar91,auVar119);
              auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar48,auVar48);
              local_8a0._28_4_ = auVar48._28_4_;
              local_8a0._0_28_ =
                   ZEXT1628(CONCAT412((auVar88._12_4_ + auVar88._12_4_) * auVar46._12_4_,
                                      CONCAT48((auVar88._8_4_ + auVar88._8_4_) * auVar46._8_4_,
                                               CONCAT44((auVar88._4_4_ + auVar88._4_4_) *
                                                        auVar46._4_4_,
                                                        (auVar88._0_4_ + auVar88._0_4_) *
                                                        auVar46._0_4_))));
              uVar52 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar110._4_4_ = uVar52;
              auVar110._0_4_ = uVar52;
              auVar110._8_4_ = uVar52;
              auVar110._12_4_ = uVar52;
              auVar110._16_4_ = uVar52;
              auVar110._20_4_ = uVar52;
              auVar110._24_4_ = uVar52;
              auVar110._28_4_ = uVar52;
              auVar48 = vcmpps_avx(auVar110,local_8a0,2);
              fVar3 = ray->tfar;
              auVar112._4_4_ = fVar3;
              auVar112._0_4_ = fVar3;
              auVar112._8_4_ = fVar3;
              auVar112._12_4_ = fVar3;
              auVar112._16_4_ = fVar3;
              auVar112._20_4_ = fVar3;
              auVar112._24_4_ = fVar3;
              auVar112._28_4_ = fVar3;
              auVar56 = vcmpps_avx(local_8a0,auVar112,2);
              auVar48 = vandps_avx(auVar48,auVar56);
              auVar113._0_8_ = CONCAT44(fVar94,fVar86) ^ 0x8000000080000000;
              auVar113._8_4_ = -fVar95;
              auVar113._12_4_ = -fVar96;
              auVar113._16_4_ = 0x80000000;
              auVar113._20_4_ = 0x80000000;
              auVar113._24_4_ = 0x80000000;
              auVar113._28_4_ = 0x80000000;
              auVar56 = vcmpps_avx(auVar113,auVar91,4);
              auVar48 = vandps_avx(auVar48,auVar56);
              auVar46 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
              auVar47 = vpand_avx(auVar46,auVar47);
              local_900 = vpmovsxwd_avx2(auVar47);
              if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_900 >> 0x7f,0) == '\0') &&
                    (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_900 >> 0xbf,0) == '\0') &&
                  (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_900[0x1f]) goto LAB_004bba5a;
              local_ac0._0_8_ = lVar38;
              uStack_9b0 = 0;
              uStack_9ac = 0;
              uStack_9a8 = 0;
              uStack_9a4 = 0;
              local_9a0 = ZEXT1632(auVar87);
              auVar48 = vrcpps_avx(local_980);
              auVar131 = ZEXT3264(local_aa0);
              local_820 = local_aa0;
              auVar92._8_4_ = 0x3f800000;
              auVar92._0_8_ = 0x3f8000003f800000;
              auVar92._12_4_ = 0x3f800000;
              auVar92._16_4_ = 0x3f800000;
              auVar92._20_4_ = 0x3f800000;
              auVar92._24_4_ = 0x3f800000;
              auVar92._28_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_fma(local_980,auVar48,auVar92);
              auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar48,auVar48);
              auVar66._8_4_ = 0x219392ef;
              auVar66._0_8_ = 0x219392ef219392ef;
              auVar66._12_4_ = 0x219392ef;
              auVar66._16_4_ = 0x219392ef;
              auVar66._20_4_ = 0x219392ef;
              auVar66._24_4_ = 0x219392ef;
              auVar66._28_4_ = 0x219392ef;
              auVar48 = vcmpps_avx(local_a60,auVar66,5);
              auVar48 = vandps_avx(auVar48,ZEXT1632(auVar46));
              auVar30._4_4_ = fStack_9bc * auVar48._4_4_;
              auVar30._0_4_ = local_9c0 * auVar48._0_4_;
              auVar30._8_4_ = fStack_9b8 * auVar48._8_4_;
              auVar30._12_4_ = fStack_9b4 * auVar48._12_4_;
              auVar30._16_4_ = auVar48._16_4_ * 0.0;
              auVar30._20_4_ = auVar48._20_4_ * 0.0;
              auVar30._24_4_ = auVar48._24_4_ * 0.0;
              auVar30._28_4_ = 0;
              auVar56 = vminps_avx(auVar30,auVar92);
              auVar31._4_4_ = auVar87._4_4_ * auVar48._4_4_;
              auVar31._0_4_ = auVar87._0_4_ * auVar48._0_4_;
              auVar31._8_4_ = auVar87._8_4_ * auVar48._8_4_;
              auVar31._12_4_ = auVar87._12_4_ * auVar48._12_4_;
              auVar31._16_4_ = auVar48._16_4_ * 0.0;
              auVar31._20_4_ = auVar48._20_4_ * 0.0;
              auVar31._24_4_ = auVar48._24_4_ * 0.0;
              auVar31._28_4_ = auVar48._28_4_;
              auVar48 = vminps_avx(auVar31,auVar92);
              auVar91 = vsubps_avx(auVar92,auVar56);
              auVar49 = vsubps_avx(auVar92,auVar48);
              local_8c0 = vblendvps_avx(auVar48,auVar91,local_aa0);
              local_8e0 = vblendvps_avx(auVar56,auVar49,local_aa0);
              local_860._4_4_ = (float)local_a20._4_4_ * local_940._4_4_;
              local_860._0_4_ = (float)local_a20._0_4_ * local_940._0_4_;
              local_860._8_4_ = fStack_a18 * local_940._8_4_;
              local_860._12_4_ = fStack_a14 * local_940._12_4_;
              local_860._16_4_ = fStack_a10 * local_940._16_4_;
              local_860._20_4_ = fStack_a0c * local_940._20_4_;
              local_860._24_4_ = fStack_a08 * local_940._24_4_;
              local_860._28_4_ = local_8c0._28_4_;
              local_880[0] = local_960._0_4_ * (float)local_a20._0_4_;
              local_880[1] = local_960._4_4_ * (float)local_a20._4_4_;
              local_880[2] = local_960._8_4_ * fStack_a18;
              local_880[3] = local_960._12_4_ * fStack_a14;
              fStack_870 = local_960._16_4_ * fStack_a10;
              fStack_86c = local_960._20_4_ * fStack_a0c;
              fStack_868 = local_960._24_4_ * fStack_a08;
              uStack_864 = local_8e0._28_4_;
              local_840[0] = (float)local_a20._0_4_ * fVar67;
              local_840[1] = (float)local_a20._4_4_ * fVar73;
              local_840[2] = fStack_a18 * fVar74;
              local_840[3] = fStack_a14 * fVar75;
              fStack_830 = fStack_a10 * fVar76;
              fStack_82c = fStack_a0c * fVar77;
              fStack_828 = fStack_a08 * fVar78;
              uStack_824 = local_920._28_4_;
              auVar47 = vpsllw_avx(auVar47,0xf);
              auVar47 = vpacksswb_avx(auVar47,auVar47);
              uVar32 = (ulong)(byte)(SUB161(auVar47 >> 7,0) & 1 |
                                     (SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar47 >> 0x3f,0) << 7);
              auVar107 = ZEXT1664(local_c80);
              auVar111 = ZEXT1664(local_c90);
              auVar114 = ZEXT1664(local_ca0);
              auVar120 = ZEXT1664(local_cc0);
              auVar85 = ZEXT1664(local_cd0);
              auVar123 = ZEXT1664(local_cf0);
              auVar72 = ZEXT1664(local_d00);
              auVar93 = ZEXT1664(local_d10);
              auVar100 = ZEXT1664(local_d20);
              local_b80._0_8_ = context->scene;
              pSVar36 = context->scene;
              do {
                uVar35 = 0;
                for (uVar16 = uVar32; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
                {
                  uVar35 = uVar35 + 1;
                }
                local_c08 = *(uint *)((long)&local_9e0 + uVar35 * 4);
                pGVar5 = (pSVar36->geometries).items[local_c08].ptr;
                if ((pGVar5->mask & ray->mask) == 0) {
                  uVar32 = uVar32 ^ 1L << (uVar35 & 0x3f);
                }
                else {
                  local_c40._0_8_ = uVar35;
                  local_bc0._0_8_ = uVar32;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_004bbae3;
                  local_c60._0_8_ = context->args;
                  local_b20._0_8_ = uVar41;
                  local_b00._0_8_ = uVar37;
                  local_ae0._0_8_ = puVar40;
                  uVar37 = (ulong)(uint)((int)uVar35 * 4);
                  local_bf0.context = context->user;
                  local_c20 = *(undefined4 *)((long)local_880 + uVar37);
                  local_c1c = *(undefined4 *)(local_860 + uVar37);
                  local_c18 = *(undefined4 *)((long)local_840 + uVar37);
                  local_c14 = *(undefined4 *)(local_8e0 + uVar37);
                  local_c10 = *(undefined4 *)(local_8c0 + uVar37);
                  local_c0c = *(undefined4 *)((long)&local_a00 + uVar37);
                  local_c04 = (local_bf0.context)->instID[0];
                  local_c00 = (local_bf0.context)->instPrimID[0];
                  local_b40._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_8a0 + uVar37);
                  local_d24 = -1;
                  local_bf0.valid = &local_d24;
                  local_bf0.geometryUserPtr = pGVar5->userPtr;
                  local_ba0._0_8_ = ray;
                  local_bf0.hit = (RTCHitN *)&local_c20;
                  local_bf0.N = 1;
                  local_b60._0_8_ = pGVar5;
                  local_bf0.ray = (RTCRayN *)ray;
                  if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar5->occlusionFilterN)(&local_bf0), *local_bf0.valid != 0)) {
                    ray = (Ray *)local_ba0._0_8_;
                    if ((*(code **)(local_c60._0_8_ + 0x10) == (code *)0x0) ||
                       (((*(byte *)local_c60._0_8_ & 2) == 0 &&
                        ((*(byte *)(local_b60._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_004bbae3:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (**(code **)(local_c60._0_8_ + 0x10))(&local_bf0);
                    ray = (Ray *)local_ba0._0_8_;
                    if (*local_bf0.valid != 0) goto LAB_004bbae3;
                  }
                  *(undefined4 *)(local_ba0._0_8_ + 0x20) = local_b40._0_4_;
                  uVar32 = local_bc0._0_8_ ^ 1L << (local_c40._0_8_ & 0x3f);
                  auVar107 = ZEXT1664(local_c80);
                  auVar111 = ZEXT1664(local_c90);
                  auVar114 = ZEXT1664(local_ca0);
                  auVar120 = ZEXT1664(local_cc0);
                  auVar85 = ZEXT1664(local_cd0);
                  auVar123 = ZEXT1664(local_cf0);
                  auVar72 = ZEXT1664(local_d00);
                  auVar93 = ZEXT1664(local_d10);
                  auVar100 = ZEXT1664(local_d20);
                  auVar131 = ZEXT3264(local_aa0);
                  ray = (Ray *)local_ba0._0_8_;
                  puVar40 = (ulong *)local_ae0._0_8_;
                  uVar37 = local_b00._0_8_;
                  uVar41 = local_b20._0_8_;
                  auVar79._0_4_ = local_cb0;
                  fVar97 = fStack_cac;
                  fVar101 = fStack_ca8;
                  fVar102 = fStack_ca4;
                  auVar68._0_4_ = local_ce0;
                  fVar103 = fStack_cdc;
                  fVar104 = fStack_cd8;
                  fVar105 = fStack_cd4;
                }
                pSVar36 = (Scene *)local_b80._0_8_;
              } while (uVar32 != 0);
              lVar38 = local_ac0._0_8_;
            }
            lVar38 = lVar38 + 1;
          } while (lVar38 != local_c68);
        }
LAB_004bbac8:
      } while (puVar40 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }